

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  int *piVar7;
  void *__addr;
  size_type *psVar8;
  __sighandler_t p_Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong *puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  undefined8 uVar13;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  _union_1457 *p_Var15;
  size_t __len;
  vector<char_*,_std::allocator<char_*>_> argv;
  int pipe_fd [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int death_test_index;
  string internal_flag;
  string filter_flag;
  sigaction ignore_sigprof_action;
  sigaction saved_sigprof_action;
  ExecDeathTestArgs args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_200;
  int local_1e0;
  int local_1dc;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  int local_1b8 [2];
  value_type local_1b0;
  value_type local_190;
  _union_1457 local_170;
  undefined1 local_168 [8];
  ulong local_160;
  ulong uStack_158;
  _union_1457 local_d8;
  long local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [8];
  pointer local_40;
  int local_38;
  
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1b8[0] = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
                 death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  iVar3 = pipe(&local_1e0);
  if (iVar3 == -1) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"CHECK failed: File ","");
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_2c8._M_dataplus._M_p == psVar8) {
      local_2c8.field_2._M_allocated_capacity = *psVar8;
      local_2c8.field_2._8_8_ = plVar5[3];
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    }
    else {
      local_2c8.field_2._M_allocated_capacity = *psVar8;
    }
    local_2c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_308._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_308._M_dataplus._M_p == psVar8) {
      local_308.field_2._M_allocated_capacity = *psVar8;
      local_308.field_2._8_8_ = plVar5[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = *psVar8;
    }
    local_308._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_268._M_dataplus._M_p._0_4_ = 0x557;
    StreamableToString<int>(&local_2a8,(int *)&local_268);
    std::operator+(&local_2e8,&local_308,&local_2a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e8);
    local_170.sa_handler = (__sighandler_t)*plVar5;
    p_Var9 = (__sighandler_t)(plVar5 + 2);
    if (local_170.sa_handler == p_Var9) {
      local_160 = *(ulong *)p_Var9;
      uStack_158 = plVar5[3];
      local_170.sa_handler = (__sighandler_t)&local_160;
    }
    else {
      local_160 = *(ulong *)p_Var9;
    }
    local_168 = (undefined1  [8])plVar5[1];
    *plVar5 = (long)p_Var9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
    local_d8.sa_handler = (__sighandler_t)*plVar5;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.sa_handler == paVar12) {
      local_c8[0]._0_8_ = paVar12->_M_allocated_capacity;
      local_c8[0]._8_8_ = plVar5[3];
      local_d8.sa_handler = (__sighandler_t)local_c8;
    }
    else {
      local_c8[0]._0_8_ = paVar12->_M_allocated_capacity;
    }
    local_d0 = plVar5[1];
    *plVar5 = (long)paVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    DeathTestAbort((string *)&local_d8);
  }
  iVar3 = fcntl(local_1dc,2,0);
  if (iVar3 == -1) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"CHECK failed: File ","");
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_2c8._M_dataplus._M_p == psVar8) {
      local_2c8.field_2._M_allocated_capacity = *psVar8;
      local_2c8.field_2._8_8_ = plVar5[3];
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    }
    else {
      local_2c8.field_2._M_allocated_capacity = *psVar8;
    }
    local_2c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_308._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_308._M_dataplus._M_p == psVar8) {
      local_308.field_2._M_allocated_capacity = *psVar8;
      local_308.field_2._8_8_ = plVar5[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = *psVar8;
    }
    local_308._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_268._M_dataplus._M_p._0_4_ = 0x55a;
    StreamableToString<int>(&local_2a8,(int *)&local_268);
    std::operator+(&local_2e8,&local_308,&local_2a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e8);
    local_170.sa_handler = (__sighandler_t)*plVar5;
    p_Var9 = (__sighandler_t)(plVar5 + 2);
    if (local_170.sa_handler == p_Var9) {
      local_160 = *(ulong *)p_Var9;
      uStack_158 = plVar5[3];
      local_170.sa_handler = (__sighandler_t)&local_160;
    }
    else {
      local_160 = *(ulong *)p_Var9;
    }
    local_168 = (undefined1  [8])plVar5[1];
    *plVar5 = (long)p_Var9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
    local_d8.sa_handler = (__sighandler_t)*plVar5;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.sa_handler == paVar12) {
      local_c8[0]._0_8_ = paVar12->_M_allocated_capacity;
      local_c8[0]._8_8_ = plVar5[3];
      local_d8.sa_handler = (__sighandler_t)local_c8;
    }
    else {
      local_c8[0]._0_8_ = paVar12->_M_allocated_capacity;
    }
    local_d0 = plVar5[1];
    *plVar5 = (long)paVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    DeathTestAbort((string *)&local_d8);
  }
  paVar12 = &local_2c8.field_2;
  local_2c8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"--","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_308.field_2._M_allocated_capacity = *psVar8;
    local_308.field_2._8_8_ = plVar5[3];
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  }
  else {
    local_308.field_2._M_allocated_capacity = *psVar8;
    local_308._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_308._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_308);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_2e8.field_2._M_allocated_capacity = *psVar8;
    local_2e8.field_2._8_8_ = plVar5[3];
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  }
  else {
    local_2e8.field_2._M_allocated_capacity = *psVar8;
    local_2e8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2e8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  local_170.sa_handler = (__sighandler_t)&local_160;
  p_Var9 = (__sighandler_t)(plVar5 + 2);
  if ((__sighandler_t)*plVar5 == p_Var9) {
    local_160 = *(ulong *)p_Var9;
    uStack_158 = plVar5[3];
  }
  else {
    local_160 = *(ulong *)p_Var9;
    local_170.sa_handler = (__sighandler_t)*plVar5;
  }
  local_168 = (undefined1  [8])plVar5[1];
  *plVar5 = (long)p_Var9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar10) {
    local_c8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_c8[0]._8_8_ = plVar5[3];
    local_d8.sa_handler = (__sighandler_t)local_c8;
  }
  else {
    local_c8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_d8.sa_handler = (__sighandler_t)*plVar5;
  }
  local_d0 = plVar5[1];
  *plVar5 = (long)paVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_190.field_2._M_allocated_capacity = *psVar8;
    local_190.field_2._8_8_ = plVar5[3];
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar8;
    local_190._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_190._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.sa_handler != local_c8) {
    operator_delete(local_d8.sa_handler,local_c8[0]._M_allocated_capacity + 1);
  }
  if (local_170.sa_handler != (__sighandler_t)&local_160) {
    operator_delete(local_170.sa_handler,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar12) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"--","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_268.field_2._M_allocated_capacity = *psVar8;
    local_268.field_2._8_8_ = plVar5[3];
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  }
  else {
    local_268.field_2._M_allocated_capacity = *psVar8;
    local_268._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_268._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_2a8.field_2._M_allocated_capacity = *psVar8;
    local_2a8.field_2._8_8_ = plVar5[3];
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar8;
    local_2a8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2a8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_288.field_2._M_allocated_capacity = *psVar8;
    local_288.field_2._8_8_ = plVar5[3];
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = *psVar8;
    local_288._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_288._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
  puVar11 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_2c8.field_2._M_allocated_capacity = *puVar11;
    local_2c8.field_2._8_8_ = plVar5[3];
    local_2c8._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_2c8.field_2._M_allocated_capacity = *puVar11;
    local_2c8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2c8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  StreamableToString<int>(&local_200,&this->line_);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar12) {
    uVar13 = local_2c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_200._M_string_length + local_2c8._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_200._M_dataplus._M_p._4_4_,local_200._M_dataplus._M_p._0_4_) !=
        &local_200.field_2) {
      uVar13 = local_200.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_200._M_string_length + local_2c8._M_string_length) goto LAB_0011ddc9;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_200,0,(char *)0x0,(ulong)local_2c8._M_dataplus._M_p);
  }
  else {
LAB_0011ddc9:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_2c8,
                        CONCAT44(local_200._M_dataplus._M_p._4_4_,local_200._M_dataplus._M_p._0_4_))
    ;
  }
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  psVar8 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_308.field_2._M_allocated_capacity = *psVar8;
    local_308.field_2._8_8_ = puVar6[3];
  }
  else {
    local_308.field_2._M_allocated_capacity = *psVar8;
    local_308._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_308._M_string_length = puVar6[1];
  *puVar6 = psVar8;
  puVar6[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_308);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  puVar11 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_2e8.field_2._M_allocated_capacity = *puVar11;
    local_2e8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_2e8.field_2._M_allocated_capacity = *puVar11;
    local_2e8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2e8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  StreamableToString<int>((string *)local_1d8,local_1b8);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    uVar13 = local_2e8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_1d8._8_8_ + local_2e8._M_string_length) {
    uVar13 = 0xf;
    if ((_union_1457 *)local_1d8._0_8_ != (_union_1457 *)(local_1d8 + 0x10)) {
      uVar13 = local_1c8._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_1d8._8_8_ + local_2e8._M_string_length) goto LAB_0011deed;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)local_1d8,0,(char *)0x0,(ulong)local_2e8._M_dataplus._M_p);
  }
  else {
LAB_0011deed:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,local_1d8._0_8_);
  }
  local_170.sa_handler = (__sighandler_t)&local_160;
  p_Var9 = (__sighandler_t)(puVar6 + 2);
  if ((__sighandler_t)*puVar6 == p_Var9) {
    local_160 = *(ulong *)p_Var9;
    uStack_158 = puVar6[3];
  }
  else {
    local_160 = *(ulong *)p_Var9;
    local_170.sa_handler = (__sighandler_t)*puVar6;
  }
  local_168 = (undefined1  [8])puVar6[1];
  *puVar6 = p_Var9;
  puVar6[1] = 0;
  *p_Var9 = (__sighandler_t)0x0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar10) {
    local_c8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_c8[0]._8_8_ = plVar5[3];
    local_d8.sa_handler = (__sighandler_t)local_c8;
  }
  else {
    local_c8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_d8.sa_handler = (__sighandler_t)*plVar5;
  }
  local_d0 = plVar5[1];
  *plVar5 = (long)paVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  StreamableToString<int>(&local_228,&local_1dc);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.sa_handler != local_c8) {
    uVar13 = local_c8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_228._M_string_length + local_d0) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar13 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_228._M_string_length + local_d0) goto LAB_0011e034;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_0011e034:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_228._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  psVar8 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1b0.field_2._M_allocated_capacity = *psVar8;
    local_1b0.field_2._8_8_ = puVar6[3];
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar8;
    local_1b0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_1b0._M_string_length = puVar6[1];
  *puVar6 = psVar8;
  puVar6[1] = 0;
  *(undefined1 *)psVar8 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.sa_handler != local_c8) {
    operator_delete(local_d8.sa_handler,local_c8[0]._M_allocated_capacity + 1);
  }
  if (local_170.sa_handler != (__sighandler_t)&local_160) {
    operator_delete(local_170.sa_handler,local_160 + 1);
  }
  if ((_union_1457 *)local_1d8._0_8_ != (_union_1457 *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_200._M_dataplus._M_p._4_4_,local_200._M_dataplus._M_p._0_4_) !=
      &local_200.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_200._M_dataplus._M_p._4_4_,local_200._M_dataplus._M_p._0_4_),
                    local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar12) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  GetInjectableArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,&local_190);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,&local_1b0);
  local_d8.sa_handler = (__sighandler_t)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.sa_handler != local_c8) {
    operator_delete(local_d8.sa_handler,local_c8[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  local_228._M_dataplus._M_p = (pointer)0x0;
  local_228._M_string_length = 0;
  local_228.field_2._M_allocated_capacity = 0;
  std::vector<char_*,_std::allocator<char_*>_>::reserve
            ((vector<char_*,_std::allocator<char_*>_> *)&local_228,
             ((long)(local_1d8._8_8_ - local_1d8._0_8_) >> 5) + 1);
  if (local_1d8._0_8_ != local_1d8._8_8_) {
    p_Var15 = (_union_1457 *)local_1d8._0_8_;
    do {
      local_d8 = *p_Var15;
      if (local_228._M_string_length == local_228.field_2._M_allocated_capacity) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*>
                  ((vector<char*,std::allocator<char*>> *)&local_228,
                   (iterator)local_228._M_string_length,(char **)&local_d8.sa_handler);
      }
      else {
        *(_union_1457 *)local_228._M_string_length = local_d8;
        local_228._M_string_length = local_228._M_string_length + 8;
      }
      p_Var15 = p_Var15 + 4;
    } while (p_Var15 != (_union_1457 *)local_1d8._8_8_);
  }
  local_d8.sa_handler = (__sighandler_t)0x0;
  if (local_228._M_string_length == local_228.field_2._M_allocated_capacity) {
    std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*>
              ((vector<char*,std::allocator<char*>> *)&local_228,
               (iterator)local_228._M_string_length,(char **)&local_d8.sa_handler);
  }
  else {
    *(char **)local_228._M_string_length = (char *)0x0;
    local_228._M_string_length = local_228._M_string_length + 8;
  }
  local_40 = local_228._M_dataplus._M_p;
  local_38 = local_1e0;
  memset(&local_170,0,0x98);
  sigemptyset((sigset_t *)local_168);
  local_170 = (_union_1457)0x1;
  while (iVar3 = sigaction(0x1b,(sigaction *)&local_170,(sigaction *)&local_d8),
        cVar2 = FLAGS_gtest_death_test_use_fork, iVar3 == -1) {
    piVar7 = __errno_location();
    if (*piVar7 != 4) {
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"CHECK failed: File ","")
      ;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
      local_268._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_268._M_dataplus._M_p == psVar8) {
        local_268.field_2._M_allocated_capacity = *psVar8;
        local_268.field_2._8_8_ = plVar5[3];
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      }
      else {
        local_268.field_2._M_allocated_capacity = *psVar8;
      }
      local_268._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_2a8._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_2a8._M_dataplus._M_p == psVar8) {
        local_2a8.field_2._M_allocated_capacity = *psVar8;
        local_2a8.field_2._8_8_ = plVar5[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar8;
      }
      local_2a8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_1b8[1] = 0x515;
      StreamableToString<int>(&local_200,local_1b8 + 1);
      std::operator+(&local_288,&local_2a8,&local_200);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_2c8._M_dataplus._M_p == psVar8) {
        local_2c8.field_2._M_allocated_capacity = *psVar8;
        local_2c8.field_2._8_8_ = plVar5[3];
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      }
      else {
        local_2c8.field_2._M_allocated_capacity = *psVar8;
      }
      local_2c8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_308._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_308._M_dataplus._M_p == psVar8) {
        local_308.field_2._M_allocated_capacity = *psVar8;
        local_308.field_2._8_8_ = plVar5[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = *psVar8;
      }
      local_308._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_308);
      local_2e8._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_2e8._M_dataplus._M_p == psVar8) {
        local_2e8.field_2._M_allocated_capacity = *psVar8;
        local_2e8.field_2._8_8_ = plVar5[3];
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      }
      else {
        local_2e8.field_2._M_allocated_capacity = *psVar8;
      }
      local_2e8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      DeathTestAbort(&local_2e8);
    }
  }
  iVar3 = -1;
  if (FLAGS_gtest_death_test_use_fork == '\0') {
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
      AssumeRole();
    }
    iVar3 = getpagesize();
    __len = (size_t)(iVar3 * 2);
    __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
    if (__addr == (void *)0xffffffffffffffff) {
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CHECK failed: File ","")
      ;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_2a8._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_2a8._M_dataplus._M_p == psVar8) {
        local_2a8.field_2._M_allocated_capacity = *psVar8;
        local_2a8.field_2._8_8_ = plVar5[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar8;
      }
      local_2a8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_288._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_288._M_dataplus._M_p == psVar8) {
        local_288.field_2._M_allocated_capacity = *psVar8;
        local_288.field_2._8_8_ = plVar5[3];
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar8;
      }
      local_288._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_200._M_dataplus._M_p._0_4_ = 0x521;
      StreamableToString<int>(&local_248,(int *)&local_200);
      std::operator+(&local_2c8,&local_288,&local_248);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_308._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_308._M_dataplus._M_p == psVar8) {
        local_308.field_2._M_allocated_capacity = *psVar8;
        local_308.field_2._8_8_ = plVar5[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = *psVar8;
      }
      local_308._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_308);
      local_2e8._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_2e8._M_dataplus._M_p == psVar8) {
        local_2e8.field_2._M_allocated_capacity = *psVar8;
        local_2e8.field_2._8_8_ = plVar5[3];
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      }
      else {
        local_2e8.field_2._M_allocated_capacity = *psVar8;
      }
      local_2e8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      DeathTestAbort(&local_2e8);
    }
    lVar14 = 0;
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
      lVar14 = __len - 0x40;
    }
    if (((uint)(iVar3 * 2) < 0x41) || (((ulong)(lVar14 + (long)__addr) & 0x3f) != 0)) {
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CHECK failed: File ","")
      ;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_2a8._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_2a8._M_dataplus._M_p == psVar8) {
        local_2a8.field_2._M_allocated_capacity = *psVar8;
        local_2a8.field_2._8_8_ = plVar5[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar8;
      }
      local_2a8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_288._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_288._M_dataplus._M_p == psVar8) {
        local_288.field_2._M_allocated_capacity = *psVar8;
        local_288.field_2._8_8_ = plVar5[3];
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar8;
      }
      local_288._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_200._M_dataplus._M_p._0_4_ = 0x52f;
      StreamableToString<int>(&local_248,(int *)&local_200);
      std::operator+(&local_2c8,&local_288,&local_248);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_308._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_308._M_dataplus._M_p == psVar8) {
        local_308.field_2._M_allocated_capacity = *psVar8;
        local_308.field_2._8_8_ = plVar5[3];
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      }
      else {
        local_308.field_2._M_allocated_capacity = *psVar8;
      }
      local_308._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_308);
      local_2e8._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_2e8._M_dataplus._M_p == psVar8) {
        local_2e8.field_2._M_allocated_capacity = *psVar8;
        local_2e8.field_2._8_8_ = plVar5[3];
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      }
      else {
        local_2e8.field_2._M_allocated_capacity = *psVar8;
      }
      local_2e8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      DeathTestAbort(&local_2e8);
    }
    iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar14 + (long)__addr),0x11,&local_40);
    iVar4 = munmap(__addr,__len);
    if (iVar4 == -1) goto LAB_0011ec0e;
  }
  if ((cVar2 == '\0') || (iVar3 = fork(), iVar3 != 0)) {
    do {
      iVar4 = sigaction(0x1b,(sigaction *)&local_d8,(sigaction *)0x0);
      if (iVar4 != -1) {
        if (iVar3 == -1) {
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_268,"CHECK failed: File ","");
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
          local_2a8._M_dataplus._M_p = (pointer)*plVar5;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_2a8._M_dataplus._M_p == psVar8) {
            local_2a8.field_2._M_allocated_capacity = *psVar8;
            local_2a8.field_2._8_8_ = plVar5[3];
            local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          }
          else {
            local_2a8.field_2._M_allocated_capacity = *psVar8;
          }
          local_2a8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
          local_288._M_dataplus._M_p = (pointer)*plVar5;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_288._M_dataplus._M_p == psVar8) {
            local_288.field_2._M_allocated_capacity = *psVar8;
            local_288.field_2._8_8_ = plVar5[3];
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar8;
          }
          local_288._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          local_200._M_dataplus._M_p._0_4_ = 0x542;
          StreamableToString<int>(&local_248,(int *)&local_200);
          std::operator+(&local_2c8,&local_288,&local_248);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
          local_308._M_dataplus._M_p = (pointer)*plVar5;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_308._M_dataplus._M_p == psVar8) {
            local_308.field_2._M_allocated_capacity = *psVar8;
            local_308.field_2._8_8_ = plVar5[3];
            local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          }
          else {
            local_308.field_2._M_allocated_capacity = *psVar8;
          }
          local_308._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_308);
          local_2e8._M_dataplus._M_p = (pointer)*plVar5;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_2e8._M_dataplus._M_p == psVar8) {
            local_2e8.field_2._M_allocated_capacity = *psVar8;
            local_2e8.field_2._8_8_ = plVar5[3];
            local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          }
          else {
            local_2e8.field_2._M_allocated_capacity = *psVar8;
          }
          local_2e8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          DeathTestAbort(&local_2e8);
        }
        do {
          iVar4 = close(local_1dc);
          if (iVar4 != -1) {
            *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar3;
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_1e0;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            if (local_228._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(local_228._M_dataplus._M_p,
                              local_228.field_2._M_allocated_capacity -
                              (long)local_228._M_dataplus._M_p);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1
                             );
            }
            return OVERSEE_TEST;
          }
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,"CHECK failed: File ","");
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
        local_288._M_dataplus._M_p = (pointer)*plVar5;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_288._M_dataplus._M_p == psVar8) {
          local_288.field_2._M_allocated_capacity = *psVar8;
          local_288.field_2._8_8_ = plVar5[3];
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        }
        else {
          local_288.field_2._M_allocated_capacity = *psVar8;
        }
        local_288._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
        local_2c8._M_dataplus._M_p = (pointer)*plVar5;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_2c8._M_dataplus._M_p == psVar8) {
          local_2c8.field_2._M_allocated_capacity = *psVar8;
          local_2c8.field_2._8_8_ = plVar5[3];
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        }
        else {
          local_2c8.field_2._M_allocated_capacity = *psVar8;
        }
        local_2c8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_248._M_dataplus._M_p._0_4_ = 0x571;
        StreamableToString<int>(&local_268,(int *)&local_248);
        std::operator+(&local_308,&local_2c8,&local_268);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_308);
        local_2e8._M_dataplus._M_p = (pointer)*plVar5;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_2e8._M_dataplus._M_p == psVar8) {
          local_2e8.field_2._M_allocated_capacity = *psVar8;
          local_2e8.field_2._8_8_ = plVar5[3];
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar8;
        }
        local_2e8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e8);
        local_170.sa_handler = (__sighandler_t)*plVar5;
        p_Var9 = (__sighandler_t)(plVar5 + 2);
        if (local_170.sa_handler == p_Var9) {
          local_160 = *(ulong *)p_Var9;
          uStack_158 = plVar5[3];
          local_170.sa_handler = (__sighandler_t)&local_160;
        }
        else {
          local_160 = *(ulong *)p_Var9;
        }
        local_168 = (undefined1  [8])plVar5[1];
        *plVar5 = (long)p_Var9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
        local_d8.sa_handler = (__sighandler_t)*plVar5;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.sa_handler == paVar12) {
          local_c8[0]._0_8_ = paVar12->_M_allocated_capacity;
          local_c8[0]._8_8_ = plVar5[3];
          local_d8.sa_handler = (__sighandler_t)local_c8;
        }
        else {
          local_c8[0]._0_8_ = paVar12->_M_allocated_capacity;
        }
        local_d0 = plVar5[1];
        *plVar5 = (long)paVar12;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        DeathTestAbort((string *)&local_d8);
      }
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"CHECK failed: File ","");
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_268._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_268._M_dataplus._M_p == psVar8) {
      local_268.field_2._M_allocated_capacity = *psVar8;
      local_268.field_2._8_8_ = plVar5[3];
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar8;
    }
    local_268._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_2a8._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_2a8._M_dataplus._M_p == psVar8) {
      local_2a8.field_2._M_allocated_capacity = *psVar8;
      local_2a8.field_2._8_8_ = plVar5[3];
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = *psVar8;
    }
    local_2a8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_1b8[1] = 0x53f;
    StreamableToString<int>(&local_200,local_1b8 + 1);
    std::operator+(&local_288,&local_2a8,&local_200);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
    local_2c8._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_2c8._M_dataplus._M_p == psVar8) {
      local_2c8.field_2._M_allocated_capacity = *psVar8;
      local_2c8.field_2._8_8_ = plVar5[3];
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    }
    else {
      local_2c8.field_2._M_allocated_capacity = *psVar8;
    }
    local_2c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_308._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_308._M_dataplus._M_p == psVar8) {
      local_308.field_2._M_allocated_capacity = *psVar8;
      local_308.field_2._8_8_ = plVar5[3];
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    }
    else {
      local_308.field_2._M_allocated_capacity = *psVar8;
    }
    local_308._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_308);
    local_2e8._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_2e8._M_dataplus._M_p == psVar8) {
      local_2e8.field_2._M_allocated_capacity = *psVar8;
      local_2e8.field_2._8_8_ = plVar5[3];
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *psVar8;
    }
    local_2e8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    DeathTestAbort(&local_2e8);
  }
  ExecDeathTestChildMain(&local_40);
LAB_0011ec0e:
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
  local_2a8._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_2a8._M_dataplus._M_p == psVar8) {
    local_2a8.field_2._M_allocated_capacity = *psVar8;
    local_2a8.field_2._8_8_ = plVar5[3];
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar8;
  }
  local_2a8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  local_288._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_288._M_dataplus._M_p == psVar8) {
    local_288.field_2._M_allocated_capacity = *psVar8;
    local_288.field_2._8_8_ = plVar5[3];
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = *psVar8;
  }
  local_288._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_200._M_dataplus._M_p._0_4_ = 0x533;
  StreamableToString<int>(&local_248,(int *)&local_200);
  std::operator+(&local_2c8,&local_288,&local_248);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  local_308._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_308._M_dataplus._M_p == psVar8) {
    local_308.field_2._M_allocated_capacity = *psVar8;
    local_308.field_2._8_8_ = plVar5[3];
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  }
  else {
    local_308.field_2._M_allocated_capacity = *psVar8;
  }
  local_308._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_308);
  local_2e8._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_2e8._M_dataplus._M_p == psVar8) {
    local_2e8.field_2._M_allocated_capacity = *psVar8;
    local_2e8.field_2._8_8_ = plVar5[3];
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  }
  else {
    local_2e8.field_2._M_allocated_capacity = *psVar8;
  }
  local_2e8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  DeathTestAbort(&local_2e8);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::vector<char*> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.data(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}